

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

int __thiscall
yy::parser::context::expected_tokens(context *this,symbol_kind_type *yyarg,int yyargn)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  symbol_kind_type yytoken;
  bool bVar7;
  
  if (this->yyparser_->yy_lac_established_ == false) {
    yy_lac_check_(this->yyparser_,
                  (this->yyla_->super_basic_symbol<yy::parser::by_kind>).super_by_kind.kind_);
  }
  bVar7 = false;
  uVar5 = 0xfffffffd;
  iVar6 = 0;
  do {
    yytoken = uVar5 + S_UTF8_BOM;
    bVar1 = true;
    if ((uVar5 < 0xfffffffe) && (bVar2 = yy_lac_check_(this->yyparser_,yytoken), bVar2)) {
      if (yyarg == (symbol_kind_type *)0x0) {
        iVar6 = iVar6 + 1;
      }
      else if (iVar6 == yyargn) {
        bVar1 = false;
      }
      else {
        lVar4 = (long)iVar6;
        iVar6 = iVar6 + 1;
        yyarg[lVar4] = yytoken;
      }
    }
    if (!bVar1) break;
    bVar7 = 0x11 < (uint)yytoken;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x10);
  iVar3 = 0;
  if ((((bVar7) && (iVar3 = iVar6, 0 < yyargn)) && (yyarg != (symbol_kind_type *)0x0)) &&
     (iVar6 == 0)) {
    *yyarg = S_YYEMPTY;
  }
  return iVar3;
}

Assistant:

int
  parser::context::expected_tokens (symbol_kind_type yyarg[], int yyargn) const
  {
    // Actual number of expected tokens
    int yycount = 0;

#if YYDEBUG
    // Execute LAC once. We don't care if it is successful, we
    // only do it for the sake of debugging output.
    if (!yyparser_.yy_lac_established_)
      yyparser_.yy_lac_check_ (yyla_.kind ());
#endif

    for (int yyx = 0; yyx < YYNTOKENS; ++yyx)
      {
        symbol_kind_type yysym = YY_CAST (symbol_kind_type, yyx);
        if (yysym != symbol_kind::S_YYerror
            && yysym != symbol_kind::S_YYUNDEF
            && yyparser_.yy_lac_check_ (yysym))
          {
            if (!yyarg)
              ++yycount;
            else if (yycount == yyargn)
              return 0;
            else
              yyarg[yycount++] = yysym;
          }
      }
    if (yyarg && yycount == 0 && 0 < yyargn)
      yyarg[0] = symbol_kind::S_YYEMPTY;
    return yycount;
  }